

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaPSVIIDCBindingPtr_conflict xmlSchemaIDCNewBinding(xmlSchemaIDCPtr_conflict idcDef)

{
  xmlSchemaPSVIIDCBindingPtr_conflict ret;
  xmlSchemaIDCPtr_conflict idcDef_local;
  
  idcDef_local = (xmlSchemaIDCPtr_conflict)(*xmlMalloc)(0x28);
  if (idcDef_local == (xmlSchemaIDCPtr_conflict)0x0) {
    xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0,"allocating a PSVI IDC binding item",
                        (xmlNodePtr)0x0);
    idcDef_local = (xmlSchemaIDCPtr_conflict)0x0;
  }
  else {
    memset(idcDef_local,0,0x28);
    idcDef_local->annot = (xmlSchemaAnnotPtr)idcDef;
  }
  return (xmlSchemaPSVIIDCBindingPtr_conflict)idcDef_local;
}

Assistant:

static xmlSchemaPSVIIDCBindingPtr
xmlSchemaIDCNewBinding(xmlSchemaIDCPtr idcDef)
{
    xmlSchemaPSVIIDCBindingPtr ret;

    ret = (xmlSchemaPSVIIDCBindingPtr) xmlMalloc(
	    sizeof(xmlSchemaPSVIIDCBinding));
    if (ret == NULL) {
	xmlSchemaVErrMemory(NULL,
	    "allocating a PSVI IDC binding item", NULL);
	return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaPSVIIDCBinding));
    ret->definition = idcDef;
    return (ret);
}